

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNLLex.cpp
# Opt level: O3

void __thiscall SNLLex::sourceStream(SNLLex *this)

{
  pointer pcVar1;
  string sourceCode;
  string local_58;
  string local_38;
  
  pcVar1 = (this->fileName)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->fileName)._M_string_length);
  readFileAsString(&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  while (((ulong)(long)this->cursor < local_58._M_string_length &&
         (skipWhiteChar(this,&local_58), (ulong)(long)this->cursor < local_58._M_string_length))) {
    this->curState = 0;
    resolveToken(this,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SNLLex::sourceStream() {
    string sourceCode = readFileAsString(this->fileName);
    while (cursor < sourceCode.length()) {
        skipWhiteChar(sourceCode);
        if (cursor >= sourceCode.length()) {
            return;
        }
        resetState();
        resolveToken(sourceCode);
    }
}